

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1-format-common.c
# Opt level: O0

void la_format_SEQUENCE_OF_as_json(la_asn1_formatter_params p,la_asn1_formatter_func cb)

{
  long *plVar1;
  long *plVar2;
  code *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  long *in_stack_00000020;
  void *memb_ptr;
  int i;
  asn_anonymous_set_ *list;
  asn_TYPE_member_t *elm;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_1c;
  
  la_json_array_start((la_vstring *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  plVar2 = in_stack_00000020;
  for (local_1c = 0; local_1c < (int)plVar2[1]; local_1c = local_1c + 1) {
    plVar1 = *(long **)(*plVar2 + (long)local_1c * 8);
    if (plVar1 != (long *)0x0) {
      la_json_object_start
                ((la_vstring *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffa8 = in_stack_00000008;
      in_stack_ffffffffffffffac = in_stack_0000000c;
      in_stack_ffffffffffffffb0 = in_stack_00000010;
      in_stack_ffffffffffffffb4 = in_stack_00000014;
      in_stack_00000020 = plVar1;
      (*in_RDI)();
      la_json_object_end((la_vstring *)0x176c60);
    }
  }
  la_json_array_end((la_vstring *)0x176c7d);
  return;
}

Assistant:

void la_format_SEQUENCE_OF_as_json(la_asn1_formatter_params p, la_asn1_formatter_func cb) {
	la_json_array_start(p.vstr, p.label);
	asn_TYPE_member_t *elm = p.td->elements;
	asn_anonymous_set_ const *list = _A_CSET_FROM_VOID(p.sptr);
	for(int i = 0; i < list->count; i++) {
		void const *memb_ptr = list->array[i];
		if(memb_ptr == NULL) {
			continue;
		}
		la_json_object_start(p.vstr, NULL);
		p.td = elm->type;
		p.sptr = memb_ptr;
		cb(p);
		la_json_object_end(p.vstr);
	}
	la_json_array_end(p.vstr);
}